

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

uintptr_t ngx_escape_html(u_char *dst,u_char *src,size_t size)

{
  u_char uVar1;
  size_t sVar2;
  
  if (dst == (u_char *)0x0) {
    dst = (u_char *)0x0;
    for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
      uVar1 = src[sVar2];
      if (uVar1 == '\"') {
        dst = dst + 5;
      }
      else if (uVar1 == '&') {
        dst = dst + 4;
      }
      else if ((uVar1 == '>') || (uVar1 == '<')) {
        dst = dst + 3;
      }
    }
  }
  else {
    for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
      uVar1 = src[sVar2];
      if (uVar1 == '\"') {
        builtin_memcpy(dst,"&quot;",6);
        dst = dst + 6;
      }
      else if (uVar1 == '&') {
        builtin_memcpy(dst,"&amp;",5);
        dst = dst + 5;
      }
      else {
        if (uVar1 == '>') {
          builtin_memcpy(dst,"&gt;",4);
        }
        else {
          if (uVar1 != '<') {
            *dst = uVar1;
            dst = dst + 1;
            goto LAB_00117a20;
          }
          builtin_memcpy(dst,"&lt;",4);
        }
        dst = dst + 4;
      }
LAB_00117a20:
    }
  }
  return (uintptr_t)dst;
}

Assistant:

uintptr_t
ngx_escape_html(u_char *dst, u_char *src, size_t size)
{
    u_char      ch;
    ngx_uint_t  len;

    if (dst == NULL) {

        len = 0;

        while (size) {
            switch (*src++) {

            case '<':
                len += sizeof("&lt;") - 2;
                break;

            case '>':
                len += sizeof("&gt;") - 2;
                break;

            case '&':
                len += sizeof("&amp;") - 2;
                break;

            case '"':
                len += sizeof("&quot;") - 2;
                break;

            default:
                break;
            }
            size--;
        }

        return (uintptr_t) len;
    }

    while (size) {
        ch = *src++;

        switch (ch) {

        case '<':
            *dst++ = '&'; *dst++ = 'l'; *dst++ = 't'; *dst++ = ';';
            break;

        case '>':
            *dst++ = '&'; *dst++ = 'g'; *dst++ = 't'; *dst++ = ';';
            break;

        case '&':
            *dst++ = '&'; *dst++ = 'a'; *dst++ = 'm'; *dst++ = 'p';
            *dst++ = ';';
            break;

        case '"':
            *dst++ = '&'; *dst++ = 'q'; *dst++ = 'u'; *dst++ = 'o';
            *dst++ = 't'; *dst++ = ';';
            break;

        default:
            *dst++ = ch;
            break;
        }
        size--;
    }

    return (uintptr_t) dst;
}